

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_module_t * wasm_module_new(wasm_store_t *store,wasm_byte_vec_t *binary)

{
  size_t size;
  wasm_byte_t *data;
  long lVar1;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar2;
  Result RVar3;
  char *pcVar4;
  wasm_module_t *this;
  Errors errors;
  undefined1 local_2a0 [32];
  Ptr local_280;
  ModuleDesc module_desc;
  ModuleDesc local_148;
  
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&module_desc,0,0x120);
  size = binary->size;
  data = binary->data;
  wabt::Features::EnableAll(&s_features);
  pcVar4 = getenv("WASM_API_DEBUG");
  uVar2 = s_log_stream;
  if (pcVar4 != (char *)0x0) {
    wabt::FileStream::CreateStderr();
    uVar2._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
    super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl._5_3_ = local_2a0._5_3_;
    uVar2._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
    super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl._0_5_ = local_2a0._0_5_;
    local_2a0[0] = false;
    local_2a0[1] = false;
    local_2a0[2] = false;
    local_2a0[3] = false;
    local_2a0[4] = false;
    local_2a0[5] = false;
    local_2a0[6] = false;
    local_2a0[7] = false;
    if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
        s_log_stream._M_t.
        super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
        super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
        super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
      lVar1 = *(long *)s_log_stream._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      s_log_stream._M_t.
      super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
      super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
           uVar2._M_t.
           super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
           super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      (**(code **)(lVar1 + 8))();
      uVar2._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
           s_log_stream._M_t.
           super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
           super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      if ((long *)CONCAT35(local_2a0._5_3_,local_2a0._0_5_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT35(local_2a0._5_3_,local_2a0._0_5_) + 8))();
        uVar2 = s_log_stream;
      }
    }
  }
  s_log_stream._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       uVar2._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
       _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  local_2a0[0] = s_features.exceptions_enabled_;
  local_2a0[1] = s_features.mutable_globals_enabled_;
  local_2a0[2] = s_features.sat_float_to_int_enabled_;
  local_2a0[3] = s_features.sign_extension_enabled_;
  local_2a0[4] = s_features.simd_enabled_;
  local_2a0[5] = s_features.threads_enabled_;
  local_2a0[6] = s_features.multi_value_enabled_;
  local_2a0[7] = s_features.tail_call_enabled_;
  local_2a0[8] = s_features.bulk_memory_enabled_;
  local_2a0[9] = s_features.reference_types_enabled_;
  local_2a0[10] = s_features.annotations_enabled_;
  local_2a0[0xb] = s_features.gc_enabled_;
  local_2a0[0xc] = s_features.memory64_enabled_;
  local_2a0._16_8_ =
       s_log_stream._M_t.
       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  local_2a0[0x18] = true;
  local_2a0[0x19] = true;
  local_2a0[0x1a] = true;
  RVar3 = wabt::interp::ReadBinaryInterp
                    (data,size,(ReadBinaryOptions *)local_2a0,&errors,&module_desc);
  if (RVar3.enum_ == Error) {
    local_2a0._0_5_ = SUB85(local_2a0 + 0x10,0);
    local_2a0._5_3_ = (undefined3)((ulong)(local_2a0 + 0x10) >> 0x28);
    local_2a0[8] = false;
    local_2a0[9] = false;
    local_2a0[10] = false;
    local_2a0[0xb] = false;
    local_2a0[0xc] = false;
    local_2a0._13_3_ = 0;
    local_2a0._16_8_ = local_2a0._16_8_ & 0xffffffffffffff00;
    this = (wasm_module_t *)0x0;
    wabt::FormatErrorsToFile
              (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)local_2a0,Never,0x50);
    std::__cxx11::string::_M_dispose();
  }
  else {
    this = (wasm_module_t *)operator_new(0x28);
    wabt::interp::ModuleDesc::ModuleDesc(&local_148,&module_desc);
    wabt::interp::Module::New(&local_280,&store->I,&local_148);
    wasm_module_t::wasm_module_t(this,&local_280,binary);
    wabt::interp::RefPtr<wabt::interp::Module>::reset(&local_280);
    wabt::interp::ModuleDesc::~ModuleDesc(&local_148);
  }
  wabt::interp::ModuleDesc::~ModuleDesc(&module_desc);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  return this;
}

Assistant:

own wasm_module_t* wasm_module_new(wasm_store_t* store,
                                   const wasm_byte_vec_t* binary) {
  Errors errors;
  ModuleDesc module_desc;
  if (Failed(ReadBinaryInterp(binary->data, binary->size, GetOptions(), &errors,
                              &module_desc))) {
    FormatErrorsToFile(errors, Location::Type::Binary);
    return nullptr;
  }

  return new wasm_module_t{Module::New(store->I, module_desc), binary};
}